

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void safe_fprintf(FILE_conflict *f,char *fmt,...)

{
  bool bVar1;
  char in_AL;
  char cVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *__s;
  char *pcVar6;
  size_t sVar7;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint uVar8;
  undefined8 in_R8;
  undefined8 in_R9;
  FILE *__stream;
  size_t offset;
  char *__s_00;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  wchar_t wc;
  va_list ap;
  char outbuff [256];
  char fmtbuff_stack [256];
  wchar_t local_314;
  FILE *local_310;
  undefined8 local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char local_2e8 [256];
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  char local_138 [264];
  
  local_2f8 = local_1e8;
  if (in_AL != '\0') {
    local_1b8 = in_XMM0_Qa;
    local_1a8 = in_XMM1_Qa;
    local_198 = in_XMM2_Qa;
    local_188 = in_XMM3_Qa;
    local_178 = in_XMM4_Qa;
    local_168 = in_XMM5_Qa;
    local_158 = in_XMM6_Qa;
    local_148 = in_XMM7_Qa;
  }
  local_308 = 0x3000000010;
  local_300 = &stack0x00000008;
  __s_00 = local_138;
  local_310 = (FILE *)f;
  local_1d8 = in_RDX;
  local_1d0 = in_RCX;
  local_1c8 = in_R8;
  local_1c0 = in_R9;
  uVar3 = vsnprintf(__s_00,0x100,fmt,&local_308);
  if (uVar3 < 0x100) {
LAB_00111a29:
    __s = (char *)0x0;
  }
  else {
    bVar1 = 0xff < (int)uVar3;
    uVar8 = 0x100;
    __s = (char *)0x0;
    __s_00 = local_138;
    do {
      if (bVar1) {
        uVar8 = uVar3 + 1;
      }
      else if ((int)uVar8 < 0x2000) {
        uVar8 = uVar8 * 2;
      }
      else {
        if (999999 < uVar8) {
          __s[uVar8 - 1] = '\0';
          uVar3 = uVar8;
          break;
        }
        uVar8 = uVar8 + (uVar8 >> 2);
      }
      free(__s);
      __s = (char *)malloc((ulong)uVar8);
      if (__s == (char *)0x0) {
        uVar3 = 0xff;
        goto LAB_00111a29;
      }
      local_2f8 = local_1e8;
      local_300 = &stack0x00000008;
      local_308 = 0x3000000010;
      uVar3 = vsnprintf(__s,(ulong)uVar8,fmt,&local_308);
      bVar1 = (int)uVar8 <= (int)uVar3;
      __s_00 = __s;
    } while ((int)uVar3 < 0 || bVar1);
  }
  iVar4 = mbtowc((wchar_t *)0x0,(char *)0x0,1);
  if (iVar4 != -1) {
    cVar2 = *__s_00;
    offset = 0;
    __stream = local_310;
    if (cVar2 != '\0') {
      bVar1 = true;
      do {
        if (bVar1) {
          iVar4 = mbtowc(&local_314,__s_00,(long)(int)uVar3);
          if (iVar4 == -1) {
            cVar2 = *__s_00;
            goto LAB_00111ad7;
          }
          uVar3 = uVar3 - iVar4;
          iVar5 = iswprint(local_314);
          if ((iVar5 != 0) && (local_314 != L'\\')) {
            if (iVar4 < 1) goto LAB_00111b56;
            pcVar6 = local_2e8 + offset;
            uVar8 = iVar4 + 1;
            do {
              cVar2 = *__s_00;
              __s_00 = __s_00 + 1;
              *pcVar6 = cVar2;
              pcVar6 = pcVar6 + 1;
              uVar8 = uVar8 - 1;
            } while (1 < uVar8);
            offset = (size_t)(uint)(iVar4 + (int)offset);
            goto LAB_00111b2d;
          }
          if (0 < iVar4) {
            uVar8 = iVar4 + 1;
            do {
              cVar2 = *__s_00;
              __s_00 = __s_00 + 1;
              sVar7 = bsdtar_expand_char(local_2e8,offset,cVar2);
              offset = (size_t)(uint)((int)sVar7 + (int)offset);
              uVar8 = uVar8 - 1;
              __stream = local_310;
            } while (1 < uVar8);
            goto LAB_00111b2d;
          }
        }
        else {
LAB_00111ad7:
          __s_00 = __s_00 + 1;
          sVar7 = bsdtar_expand_char(local_2e8,offset,cVar2);
          bVar1 = false;
          offset = (size_t)(uint)((int)sVar7 + (int)offset);
LAB_00111b2d:
          if (0xec < (uint)offset) {
            local_2e8[offset] = '\0';
            fputs(local_2e8,__stream);
            offset = 0;
          }
        }
LAB_00111b56:
        cVar2 = *__s_00;
      } while (cVar2 != '\0');
    }
    local_2e8[offset] = '\0';
    fputs(local_2e8,__stream);
  }
  free(__s);
  return;
}

Assistant:

void
safe_fprintf(FILE *f, const char *fmt, ...)
{
	char fmtbuff_stack[256]; /* Place to format the printf() string. */
	char outbuff[256]; /* Buffer for outgoing characters. */
	char *fmtbuff_heap; /* If fmtbuff_stack is too small, we use malloc */
	char *fmtbuff;  /* Pointer to fmtbuff_stack or fmtbuff_heap. */
	int fmtbuff_length;
	int length, n;
	va_list ap;
	const char *p;
	unsigned i;
	wchar_t wc;
	char try_wc;

	/* Use a stack-allocated buffer if we can, for speed and safety. */
	fmtbuff_heap = NULL;
	fmtbuff_length = sizeof(fmtbuff_stack);
	fmtbuff = fmtbuff_stack;

	/* Try formatting into the stack buffer. */
	va_start(ap, fmt);
	length = vsnprintf(fmtbuff, fmtbuff_length, fmt, ap);
	va_end(ap);

	/* If the result was too large, allocate a buffer on the heap. */
	while (length < 0 || length >= fmtbuff_length) {
		if (length >= fmtbuff_length)
			fmtbuff_length = length+1;
		else if (fmtbuff_length < 8192)
			fmtbuff_length *= 2;
		else if (fmtbuff_length < 1000000)
			fmtbuff_length += fmtbuff_length / 4;
		else {
			length = fmtbuff_length;
			fmtbuff_heap[length-1] = '\0';
			break;
		}
		free(fmtbuff_heap);
		fmtbuff_heap = malloc(fmtbuff_length);

		/* Reformat the result into the heap buffer if we can. */
		if (fmtbuff_heap != NULL) {
			fmtbuff = fmtbuff_heap;
			va_start(ap, fmt);
			length = vsnprintf(fmtbuff, fmtbuff_length, fmt, ap);
			va_end(ap);
		} else {
			/* Leave fmtbuff pointing to the truncated
			 * string in fmtbuff_stack. */
			length = sizeof(fmtbuff_stack) - 1;
			break;
		}
	}

	/* Note: mbrtowc() has a cleaner API, but mbtowc() seems a bit
	 * more portable, so we use that here instead. */
	if (mbtowc(NULL, NULL, 1) == -1) { /* Reset the shift state. */
		/* mbtowc() should never fail in practice, but
		 * handle the theoretical error anyway. */
		free(fmtbuff_heap);
		return;
	}

	/* Write data, expanding unprintable characters. */
	p = fmtbuff;
	i = 0;
	try_wc = 1;
	while (*p != '\0') {

		/* Convert to wide char, test if the wide
		 * char is printable in the current locale. */
		if (try_wc && (n = mbtowc(&wc, p, length)) != -1) {
			length -= n;
			if (iswprint(wc) && wc != L'\\') {
				/* Printable, copy the bytes through. */
				while (n-- > 0)
					outbuff[i++] = *p++;
			} else {
				/* Not printable, format the bytes. */
				while (n-- > 0)
					i += (unsigned)bsdtar_expand_char(
					    outbuff, i, *p++);
			}
		} else {
			/* After any conversion failure, don't bother
			 * trying to convert the rest. */
			i += (unsigned)bsdtar_expand_char(outbuff, i, *p++);
			try_wc = 0;
		}

		/* If our output buffer is full, dump it and keep going. */
		if (i > (sizeof(outbuff) - 20)) {
			outbuff[i] = '\0';
			fprintf(f, "%s", outbuff);
			i = 0;
		}
	}
	outbuff[i] = '\0';
	fprintf(f, "%s", outbuff);

	/* If we allocated a heap-based formatting buffer, free it now. */
	free(fmtbuff_heap);
}